

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
::Resize(BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
         *this)

{
  uint newSize;
  uint uVar1;
  int iVar2;
  hash_t hVar3;
  EntryType *dst;
  Type pSVar4;
  long lVar5;
  long lVar6;
  int *local_48;
  int *newBuckets;
  Type pSStack_38;
  int modIndex;
  
  CCLock::Enter((CCLock *)this);
  newSize = this->count * 2;
  newBuckets._4_4_ = 0x4b;
  uVar1 = 4;
  if (8 < newSize) {
    uVar1 = this->count & 0x7fffffff;
  }
  uVar1 = PrimePolicy::GetPrime(uVar1,(int *)((long)&newBuckets + 4));
  local_48 = (Type)0x0;
  pSStack_38 = (Type)0x0;
  if (uVar1 == this->bucketCount) {
    dst = AllocateEntries(this,newSize,true);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<void*,unsigned_long>,unsigned_long,Memory::HeapAllocator>
              (dst,(long)(int)newSize,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = dst;
    this->size = newSize;
    this->modFunctionIndex = newBuckets._4_4_;
  }
  else {
    Allocate(this,&local_48,&stack0xffffffffffffffc8,uVar1,newSize);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<void*,unsigned_long>,unsigned_long,Memory::HeapAllocator>
              (pSStack_38,(long)(int)newSize,this->entries,(long)this->count);
    this->modFunctionIndex = newBuckets._4_4_;
    iVar2 = this->count;
    if (0 < iVar2) {
      lVar5 = 8;
      lVar6 = 0;
      pSVar4 = pSStack_38;
      do {
        if (-2 < *(int *)((long)&(pSVar4->
                                 super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                 ).super_KeyValueEntry<void_*,_unsigned_long>.
                                 super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
                                 .super_KeyValueEntryDataLayout2<void_*,_unsigned_long>.value +
                         lVar5)) {
          hVar3 = PrimePolicy::ModPrime
                            ((uint)(*(ulong *)((long)&(pSVar4->
                                                  super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                                  ).super_KeyValueEntry<void_*,_unsigned_long>.
                                                  super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
                                                  .
                                                  super_KeyValueEntryDataLayout2<void_*,_unsigned_long>
                                                  .next + lVar5) >> 4) & 0x7fffffff,uVar1,
                             this->modFunctionIndex);
          *(int *)((long)&(pSStack_38->
                          super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                          ).super_KeyValueEntry<void_*,_unsigned_long>.
                          super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
                          .super_KeyValueEntryDataLayout2<void_*,_unsigned_long>.value + lVar5) =
               local_48[(int)hVar3];
          local_48[(int)hVar3] = (int)lVar6;
          iVar2 = this->count;
          pSVar4 = pSStack_38;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x18;
      } while (lVar6 < iVar2);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_48;
    this->entries = pSStack_38;
    this->bucketCount = uVar1;
    this->size = newSize;
  }
  CCLock::Leave((CCLock *)this);
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }